

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::detail::NonNegativeNumber::NonNegativeNumber(NonNegativeNumber *this)

{
  anon_class_1_0_00000001 local_45 [20];
  allocator<char> local_31;
  string local_30;
  NonNegativeNumber *local_10;
  NonNegativeNumber *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"NONNEGATIVE",&local_31);
  Validator::Validator(&this->super_Validator,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,local_45);
  return;
}

Assistant:

NonNegativeNumber() : Validator("NONNEGATIVE") {
        func_ = [](std::string &number_str) {
            double number;
            if(!detail::lexical_cast(number_str, number)) {
                return std::string("Failed parsing number: (") + number_str + ')';
            }
            if(number < 0) {
                return std::string("Number less than 0: (") + number_str + ')';
            }
            return std::string();
        };
    }